

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

shared_ptr<Jupiter::IRC::Client::Channel::User> __thiscall
Jupiter::IRC::Client::Channel::addUser(Channel *this,shared_ptr<Jupiter::IRC::Client::User> *user)

{
  undefined8 *puVar1;
  mapped_type *pmVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Jupiter::IRC::Client::Channel::User> sVar3;
  
  (this->m_name)._M_dataplus._M_p = (pointer)0x0;
  puVar1 = (undefined8 *)operator_new(0x40);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00147610;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = puVar1 + 6;
  puVar1[5] = 0;
  *(undefined1 *)(puVar1 + 6) = 0;
  (this->m_name)._M_string_length = (size_type)puVar1;
  (this->m_name)._M_dataplus._M_p = (pointer)(puVar1 + 2);
  puVar1[2] = *in_RDX;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 3),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDX + 1));
  *(int *)*in_RDX = *(int *)*in_RDX + 1;
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(user + 3),(key_type *)(*(long *)(this->m_name)._M_dataplus._M_p + 8));
  (pmVar2->super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)(this->m_name)._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar2->
              super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->m_name)._M_string_length);
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::Channel::User>)
         sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::Channel::User> Jupiter::IRC::Client::Channel::addUser(std::shared_ptr<Client::User> user) {
	auto channel_user = std::make_shared<Channel::User>();
	channel_user->m_user = user;

	++user->m_channel_count;

	m_users[channel_user->getNickname()] = channel_user;
	return channel_user;
}